

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_20;
  nn_trie trie;
  
  trie.root = (nn_trie_node *)0x0;
  iVar1 = nn_trie_match(&trie,"",0);
  if (iVar1 == 0) {
    iVar1 = nn_trie_match(&trie,(uint8_t *)"ABC",3);
    if (iVar1 == 0) {
      nn_node_term((nn_trie_node *)0x0);
      trie.root = (nn_trie_node *)0x0;
      iVar1 = nn_trie_subscribe(&trie,"",0);
      if (iVar1 == 0) {
        nn_backtrace_print();
        pcVar2 = "rc == 1";
        uStack_20 = 0x2d;
      }
      else {
        iVar1 = nn_trie_match(&trie,"",0);
        if (iVar1 == 0) {
          nn_backtrace_print();
          pcVar2 = "rc == 1";
          uStack_20 = 0x2f;
        }
        else {
          iVar1 = nn_trie_match(&trie,(uint8_t *)"ABC",3);
          if (iVar1 == 0) {
            nn_backtrace_print();
            pcVar2 = "rc == 1";
            uStack_20 = 0x31;
          }
          else {
            nn_node_term(trie.root);
            trie.root = (nn_trie_node *)0x0;
            iVar1 = nn_trie_subscribe(&trie,(uint8_t *)"ABC",3);
            if (iVar1 == 0) {
              nn_backtrace_print();
              pcVar2 = "rc == 1";
              uStack_20 = 0x37;
            }
            else {
              iVar1 = nn_trie_match(&trie,"DEF",3);
              if (iVar1 == 0) {
                iVar1 = nn_trie_match(&trie,(uint8_t *)"AB",2);
                if (iVar1 == 0) {
                  iVar1 = nn_trie_match(&trie,(uint8_t *)"ABC",3);
                  if (iVar1 == 0) {
                    nn_backtrace_print();
                    pcVar2 = "rc == 1";
                    uStack_20 = 0x3d;
                  }
                  else {
                    iVar1 = nn_trie_match(&trie,(uint8_t *)"ABCDE",5);
                    if (iVar1 == 0) {
                      nn_backtrace_print();
                      pcVar2 = "rc == 1";
                      uStack_20 = 0x3f;
                    }
                    else {
                      nn_node_term(trie.root);
                      trie.root = (nn_trie_node *)0x0;
                      iVar1 = nn_trie_subscribe(&trie,(uint8_t *)
                                                      "01234567890123456789012345678901234",0x23);
                      if (iVar1 == 0) {
                        nn_backtrace_print();
                        pcVar2 = "rc == 1";
                        uStack_20 = 0x46;
                      }
                      else {
                        iVar1 = nn_trie_match(&trie,"",0);
                        if (iVar1 == 0) {
                          iVar1 = nn_trie_match(&trie,(uint8_t *)"012456789",10);
                          if (iVar1 == 0) {
                            iVar1 = nn_trie_match(&trie,(uint8_t *)"012345678901234567",0x12);
                            if (iVar1 == 0) {
                              iVar1 = nn_trie_match(&trie,(uint8_t *)
                                                          "01234567890123456789012345678901234",0x23
                                                   );
                              if (iVar1 == 0) {
                                nn_backtrace_print();
                                pcVar2 = "rc == 1";
                                uStack_20 = 0x4f;
                              }
                              else {
                                nn_node_term(trie.root);
                                trie.root = (nn_trie_node *)0x0;
                                iVar1 = nn_trie_subscribe(&trie,(uint8_t *)"ABC",3);
                                if (iVar1 == 0) {
                                  nn_backtrace_print();
                                  pcVar2 = "rc == 1";
                                  uStack_20 = 0x55;
                                }
                                else {
                                  iVar1 = nn_trie_subscribe(&trie,(uint8_t *)"ADE",3);
                                  if (iVar1 == 0) {
                                    nn_backtrace_print();
                                    pcVar2 = "rc == 1";
                                    uStack_20 = 0x57;
                                  }
                                  else {
                                    iVar1 = nn_trie_match(&trie,(uint8_t *)"A",1);
                                    if (iVar1 == 0) {
                                      iVar1 = nn_trie_match(&trie,(uint8_t *)"AD",2);
                                      if (iVar1 == 0) {
                                        nn_node_term(trie.root);
                                        trie.root = (nn_trie_node *)0x0;
                                        iVar1 = nn_trie_subscribe(&trie,(uint8_t *)"A",1);
                                        if (iVar1 == 0) {
                                          nn_backtrace_print();
                                          pcVar2 = "rc == 1";
                                          uStack_20 = 0x61;
                                        }
                                        else {
                                          iVar1 = nn_trie_subscribe(&trie,"B",1);
                                          if (iVar1 == 0) {
                                            nn_backtrace_print();
                                            pcVar2 = "rc == 1";
                                            uStack_20 = 99;
                                          }
                                          else {
                                            iVar1 = nn_trie_subscribe(&trie,"C",1);
                                            if (iVar1 == 0) {
                                              nn_backtrace_print();
                                              pcVar2 = "rc == 1";
                                              uStack_20 = 0x65;
                                            }
                                            else {
                                              iVar1 = nn_trie_subscribe(&trie,"0",1);
                                              if (iVar1 == 0) {
                                                nn_backtrace_print();
                                                pcVar2 = "rc == 1";
                                                uStack_20 = 0x67;
                                              }
                                              else {
                                                iVar1 = nn_trie_subscribe(&trie,"E",1);
                                                if (iVar1 == 0) {
                                                  nn_backtrace_print();
                                                  pcVar2 = "rc == 1";
                                                  uStack_20 = 0x69;
                                                }
                                                else {
                                                  iVar1 = nn_trie_subscribe(&trie,"F",1);
                                                  if (iVar1 == 0) {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0x6b;
                                                  }
                                                  else {
                                                    iVar1 = nn_trie_subscribe(&trie,"1",1);
                                                    if (iVar1 == 0) {
                                                      nn_backtrace_print();
                                                      pcVar2 = "rc == 1";
                                                      uStack_20 = 0x6d;
                                                    }
                                                    else {
                                                      iVar1 = nn_trie_subscribe(&trie,(uint8_t *)"@"
                                                                                ,1);
                                                      if (iVar1 == 0) {
                                                        nn_backtrace_print();
                                                        pcVar2 = "rc == 1";
                                                        uStack_20 = 0x6f;
                                                      }
                                                      else {
                                                        iVar1 = nn_trie_subscribe(&trie,(uint8_t *)
                                                                                        "b",1);
                                                        if (iVar1 == 0) {
                                                          nn_backtrace_print();
                                                          pcVar2 = "rc == 1";
                                                          uStack_20 = 0x71;
                                                        }
                                                        else {
                                                          iVar1 = nn_trie_subscribe(&trie,"f",1);
                                                          if (iVar1 == 0) {
                                                            nn_backtrace_print();
                                                            pcVar2 = "rc == 1";
                                                            uStack_20 = 0x73;
                                                          }
                                                          else {
                                                            iVar1 = nn_trie_match(&trie,"0",1);
                                                            if (iVar1 == 0) {
                                                              nn_backtrace_print();
                                                              pcVar2 = "rc == 1";
                                                              uStack_20 = 0x75;
                                                            }
                                                            else {
                                                              iVar1 = nn_trie_match(&trie,(uint8_t *
                                                                                          )"A",1);
                                                              if (iVar1 == 0) {
                                                                nn_backtrace_print();
                                                                pcVar2 = "rc == 1";
                                                                uStack_20 = 0x77;
                                                              }
                                                              else {
                                                                iVar1 = nn_trie_match(&trie,"f",1);
                                                                if (iVar1 == 0) {
                                                                  nn_backtrace_print();
                                                                  pcVar2 = "rc == 1";
                                                                  uStack_20 = 0x79;
                                                                }
                                                                else {
                                                                  iVar1 = nn_trie_match(&trie,(
                                                  uint8_t *)"000",3);
                                                  if (iVar1 == 0) {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0x7b;
                                                  }
                                                  else {
                                                    iVar1 = nn_trie_match(&trie,(uint8_t *)"a",1);
                                                    if (iVar1 == 0) {
                                                      iVar1 = nn_trie_match(&trie,"c",1);
                                                      if (iVar1 == 0) {
                                                        nn_node_term(trie.root);
                                                        trie.root = (nn_trie_node *)0x0;
                                                        iVar1 = nn_trie_subscribe(&trie,(uint8_t *)
                                                                                        "ABCD",4);
                                                        if (iVar1 == 0) {
                                                          nn_backtrace_print();
                                                          pcVar2 = "rc == 1";
                                                          uStack_20 = 0x85;
                                                        }
                                                        else {
                                                          iVar1 = nn_trie_subscribe(&trie,(uint8_t *
                                                                                          )"AB",2);
                                                          if (iVar1 == 0) {
                                                            nn_backtrace_print();
                                                            pcVar2 = "rc == 1";
                                                            uStack_20 = 0x87;
                                                          }
                                                          else {
                                                            iVar1 = nn_node_unsubscribe(&trie.root,
                                                                                        (uint8_t *)
                                                                                        "AB",2);
                                                            if (iVar1 == 1) {
                                                              iVar1 = nn_trie_match(&trie,(uint8_t *
                                                                                          )"AB",2);
                                                              if (iVar1 == 0) {
                                                                iVar1 = nn_trie_match(&trie,(uint8_t
                                                                                             *)
                                                  "ABCDEF",6);
                                                  if (iVar1 == 0) {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0x8d;
                                                  }
                                                  else {
                                                    iVar1 = nn_trie_subscribe(&trie,(uint8_t *)
                                                                                    "ABEF",4);
                                                    if (iVar1 == 0) {
                                                      nn_backtrace_print();
                                                      pcVar2 = "rc == 1";
                                                      uStack_20 = 0x8f;
                                                    }
                                                    else {
                                                      iVar1 = nn_node_unsubscribe(&trie.root,
                                                                                  (uint8_t *)"ABCD",
                                                                                  4);
                                                      if (iVar1 == 1) {
                                                        iVar1 = nn_trie_match(&trie,(uint8_t *)
                                                                                    "ABCD",4);
                                                        if (iVar1 == 0) {
                                                          iVar1 = nn_trie_match(&trie,(uint8_t *)
                                                                                      "ABEF",4);
                                                          if (iVar1 == 0) {
                                                            nn_backtrace_print();
                                                            pcVar2 = "rc == 1";
                                                            uStack_20 = 0x95;
                                                          }
                                                          else {
                                                            nn_node_term(trie.root);
                                                            trie.root = (nn_trie_node *)0x0;
                                                            iVar1 = nn_trie_subscribe(&trie,(uint8_t
                                                                                             *)"A",1
                                                                                     );
                                                            if (iVar1 == 0) {
                                                              nn_backtrace_print();
                                                              pcVar2 = "rc == 1";
                                                              uStack_20 = 0x9b;
                                                            }
                                                            else {
                                                              iVar1 = nn_node_unsubscribe(&trie.root
                                                                                          ,(uint8_t 
                                                  *)"A",1);
                                                  if (iVar1 == 1) {
                                                    iVar1 = nn_trie_match(&trie,"",0);
                                                    if (iVar1 == 0) {
                                                      iVar1 = nn_trie_match(&trie,(uint8_t *)"A",1);
                                                      if (iVar1 == 0) {
                                                        nn_node_term(trie.root);
                                                        trie.root = (nn_trie_node *)0x0;
                                                        iVar1 = nn_trie_subscribe(&trie,(uint8_t *)
                                                                                        "A",1);
                                                        if (iVar1 == 0) {
                                                          nn_backtrace_print();
                                                          pcVar2 = "rc == 1";
                                                          uStack_20 = 0xa7;
                                                        }
                                                        else {
                                                          iVar1 = nn_trie_subscribe(&trie,"B",1);
                                                          if (iVar1 == 0) {
                                                            nn_backtrace_print();
                                                            pcVar2 = "rc == 1";
                                                            uStack_20 = 0xa9;
                                                          }
                                                          else {
                                                            iVar1 = nn_trie_subscribe(&trie,"C",1);
                                                            if (iVar1 == 0) {
                                                              nn_backtrace_print();
                                                              pcVar2 = "rc == 1";
                                                              uStack_20 = 0xab;
                                                            }
                                                            else {
                                                              iVar1 = nn_trie_subscribe(&trie,"0",1)
                                                              ;
                                                              if (iVar1 == 0) {
                                                                nn_backtrace_print();
                                                                pcVar2 = "rc == 1";
                                                                uStack_20 = 0xad;
                                                              }
                                                              else {
                                                                iVar1 = nn_trie_subscribe(&trie,"E",
                                                                                          1);
                                                                if (iVar1 == 0) {
                                                                  nn_backtrace_print();
                                                                  pcVar2 = "rc == 1";
                                                                  uStack_20 = 0xaf;
                                                                }
                                                                else {
                                                                  iVar1 = nn_trie_subscribe(&trie,
                                                  "F",1);
                                                  if (iVar1 == 0) {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xb1;
                                                  }
                                                  else {
                                                    iVar1 = nn_trie_subscribe(&trie,"1",1);
                                                    if (iVar1 == 0) {
                                                      nn_backtrace_print();
                                                      pcVar2 = "rc == 1";
                                                      uStack_20 = 0xb3;
                                                    }
                                                    else {
                                                      iVar1 = nn_trie_subscribe(&trie,(uint8_t *)"@"
                                                                                ,1);
                                                      if (iVar1 == 0) {
                                                        nn_backtrace_print();
                                                        pcVar2 = "rc == 1";
                                                        uStack_20 = 0xb5;
                                                      }
                                                      else {
                                                        iVar1 = nn_trie_subscribe(&trie,(uint8_t *)
                                                                                        "b",1);
                                                        if (iVar1 == 0) {
                                                          nn_backtrace_print();
                                                          pcVar2 = "rc == 1";
                                                          uStack_20 = 0xb7;
                                                        }
                                                        else {
                                                          iVar1 = nn_trie_subscribe(&trie,"f",1);
                                                          if (iVar1 == 0) {
                                                            nn_backtrace_print();
                                                            pcVar2 = "rc == 1";
                                                            uStack_20 = 0xb9;
                                                          }
                                                          else {
                                                            iVar1 = nn_node_unsubscribe(&trie.root,
                                                                                        "0",1);
                                                            if (iVar1 == 1) {
                                                              iVar1 = nn_node_unsubscribe(&trie.root
                                                                                          ,"f",1);
                                                              if (iVar1 == 1) {
                                                                iVar1 = nn_node_unsubscribe(&trie.
                                                  root,"E",1);
                                                  if (iVar1 == 1) {
                                                    iVar1 = nn_node_unsubscribe(&trie.root,"B",1);
                                                    if (iVar1 == 1) {
                                                      iVar1 = nn_node_unsubscribe(&trie.root,
                                                                                  (uint8_t *)"A",1);
                                                      if (iVar1 == 1) {
                                                        iVar1 = nn_node_unsubscribe(&trie.root,"1",1
                                                                                   );
                                                        if (iVar1 == 1) {
                                                          iVar1 = nn_node_unsubscribe(&trie.root,
                                                                                      (uint8_t *)"@"
                                                                                      ,1);
                                                          if (iVar1 == 1) {
                                                            iVar1 = nn_node_unsubscribe(&trie.root,
                                                                                        "F",1);
                                                            if (iVar1 == 1) {
                                                              iVar1 = nn_node_unsubscribe(&trie.root
                                                                                          ,"C",1);
                                                              if (iVar1 == 1) {
                                                                iVar1 = nn_node_unsubscribe(&trie.
                                                  root,(uint8_t *)"b",1);
                                                  if (iVar1 == 1) {
                                                    nn_node_term(trie.root);
                                                    return 0;
                                                  }
                                                  nn_backtrace_print();
                                                  pcVar2 = "rc == 1";
                                                  uStack_20 = 0xcd;
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xcb;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xc9;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 199;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xc5;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xc3;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xc1;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xbf;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xbd;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0xbb;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 0";
                                                    uStack_20 = 0xa1;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 0";
                                                    uStack_20 = 0x9f;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0x9d;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 0";
                                                    uStack_20 = 0x93;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0x91;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 0";
                                                    uStack_20 = 0x8b;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 1";
                                                    uStack_20 = 0x89;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 0";
                                                    uStack_20 = 0x7f;
                                                  }
                                                  }
                                                  else {
                                                    nn_backtrace_print();
                                                    pcVar2 = "rc == 0";
                                                    uStack_20 = 0x7d;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                      else {
                                        nn_backtrace_print();
                                        pcVar2 = "rc == 0";
                                        uStack_20 = 0x5b;
                                      }
                                    }
                                    else {
                                      nn_backtrace_print();
                                      pcVar2 = "rc == 0";
                                      uStack_20 = 0x59;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              nn_backtrace_print();
                              pcVar2 = "rc == 0";
                              uStack_20 = 0x4c;
                            }
                          }
                          else {
                            nn_backtrace_print();
                            pcVar2 = "rc == 0";
                            uStack_20 = 0x4a;
                          }
                        }
                        else {
                          nn_backtrace_print();
                          pcVar2 = "rc == 0";
                          uStack_20 = 0x48;
                        }
                      }
                    }
                  }
                }
                else {
                  nn_backtrace_print();
                  pcVar2 = "rc == 0";
                  uStack_20 = 0x3b;
                }
              }
              else {
                nn_backtrace_print();
                pcVar2 = "rc == 0";
                uStack_20 = 0x39;
              }
            }
          }
        }
      }
    }
    else {
      nn_backtrace_print();
      pcVar2 = "rc == 0";
      uStack_20 = 0x27;
    }
  }
  else {
    nn_backtrace_print();
    pcVar2 = "rc == 0";
    uStack_20 = 0x25;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/trie.c",
          uStack_20);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    struct nn_trie trie;

    /*  Try matching with an empty trie. */
    nn_trie_init (&trie);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with "all" subscription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try some simple matching. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "DEF", 3);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDE", 5);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try a long subcsription. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012456789", 10);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "012345678901234567", 18);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie,
        (const uint8_t*) "01234567890123456789012345678901234", 35);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Try matching with a sparse node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABC", 3);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ADE", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "AD", 2);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Try matching with a dense node involved. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "000", 3);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "a", 1);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "c", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);

    /*  Check prefix splitting and compaction. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "AB", 2);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCDEF", 6);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABCD", 4);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "ABEF", 4);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    /*  Check whether there's no problem with removing all subscriptions. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_match (&trie, (const uint8_t*) "", 0);
    nn_assert (rc == 0);
    rc = nn_trie_match (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 0);
    nn_trie_term (&trie);  

    /*  Check converting from sparse node to dense node and vice versa. */
    nn_trie_init (&trie);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    rc = nn_trie_subscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "0", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "f", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "E", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "B", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "A", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "1", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "@", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "F", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "C", 1);
    nn_assert (rc == 1);
    rc = nn_trie_unsubscribe (&trie, (const uint8_t*) "b", 1);
    nn_assert (rc == 1);
    nn_trie_term (&trie);

    return 0;
}